

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

ssize_t __thiscall MeshLib::Solid::read(Solid *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  double *pdVar6;
  tVertex pVVar7;
  tEdge pEVar8;
  tFace pFVar9;
  tHalfEdge pHVar10;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Solid *this_00;
  string *this_01;
  int i_1;
  long lVar11;
  int i;
  int iVar12;
  long *plVar13;
  Point p;
  string s;
  string str;
  string_token_iterator iter;
  char line [2048];
  Point local_8e8;
  string local_8c8;
  string local_8a8;
  long *local_888;
  double local_880;
  string local_878;
  string_token_iterator local_858;
  char local_838 [2056];
  
  local_888 = (long *)CONCAT44(in_register_00000034,__fd);
  plVar13 = local_888;
  do {
    do {
      if (((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 7) != 0) ||
         (plVar5 = (long *)std::istream::getline((char *)plVar13,(long)local_838),
         (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0)) {
        labelBoundaryEdges(this);
        removeDanglingVertices(this);
        return extraout_RAX;
      }
    } while (local_838[0] == '\0');
    std::__cxx11::string::string((string *)&local_8c8,local_838,(allocator *)&local_858);
    string_token_iterator::string_token_iterator(&local_858,&local_8c8," \n");
    string_token_iterator::operator*[abi_cxx11_(&local_8a8,&local_858);
    bVar1 = std::operator==(&local_8a8,"Vertex");
    if (bVar1) {
      string_token_iterator::find_next(&local_858);
      string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
      std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
      std::__cxx11::string::~string((string *)&local_878);
      iVar2 = atoi(local_8a8._M_dataplus._M_p);
      local_8e8.v[0] = 0.0;
      local_8e8.v[1] = 0.0;
      local_8e8.v[2] = 0.0;
      for (iVar12 = 0; iVar12 != 3; iVar12 = iVar12 + 1) {
        string_token_iterator::find_next(&local_858);
        string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
        std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
        std::__cxx11::string::~string((string *)&local_878);
        local_880 = atof(local_8a8._M_dataplus._M_p);
        pdVar6 = Point::operator[](&local_8e8,iVar12);
        *pdVar6 = local_880;
      }
      pVVar7 = createVertex(this,iVar2);
      (pVVar7->m_point).v[2] = local_8e8.v[2];
      (pVVar7->m_point).v[0] = local_8e8.v[0];
      (pVVar7->m_point).v[1] = local_8e8.v[1];
      pVVar7->m_id = iVar2;
      uVar3 = std::__cxx11::string::find((char *)&local_8c8,0x1156b0);
      uVar4 = std::__cxx11::string::find((char *)&local_8c8,0x115706);
      if (-1 < (int)(uVar4 | uVar3)) {
        std::__cxx11::string::substr((ulong)&local_878,(ulong)&local_8c8);
        this_01 = (string *)&pVVar7->m_string;
        goto LAB_00110710;
      }
    }
    else {
      bVar1 = std::operator==(&local_8a8,"Face");
      if (bVar1) {
        string_token_iterator::find_next(&local_858);
        string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
        std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
        std::__cxx11::string::~string((string *)&local_878);
        iVar2 = atoi(local_8a8._M_dataplus._M_p);
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          string_token_iterator::find_next(&local_858);
          string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
          std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
          std::__cxx11::string::~string((string *)&local_878);
          iVar12 = atoi(local_8a8._M_dataplus._M_p);
          *(int *)((long)local_8e8.v + lVar11 * 4) = iVar12;
        }
        pFVar9 = createFace(this,(int *)&local_8e8,iVar2);
        uVar3 = std::__cxx11::string::find((char *)&local_8c8,0x1156b0);
        uVar4 = std::__cxx11::string::find((char *)&local_8c8,0x115706);
        if (-1 < (int)(uVar4 | uVar3)) {
          std::__cxx11::string::substr((ulong)&local_878,(ulong)&local_8c8);
          std::__cxx11::string::operator=((string *)&pFVar9->m_string,(string *)&local_878);
          std::__cxx11::string::~string((string *)&local_878);
        }
      }
      else {
        bVar1 = std::operator==(&local_8a8,"Edge");
        if (bVar1) {
          string_token_iterator::find_next(&local_858);
          string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
          std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
          std::__cxx11::string::~string((string *)&local_878);
          iVar2 = atoi(local_8a8._M_dataplus._M_p);
          string_token_iterator::find_next(&local_858);
          string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
          std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
          std::__cxx11::string::~string((string *)&local_878);
          iVar12 = atoi(local_8a8._M_dataplus._M_p);
          pEVar8 = idEdge(this,iVar2,iVar12);
          string_token_iterator::find_next(&local_858);
          string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
          std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
          std::__cxx11::string::~string((string *)&local_878);
          uVar3 = std::__cxx11::string::find((char *)&local_8c8,0x1156b0);
          uVar4 = std::__cxx11::string::find((char *)&local_8c8,0x115706);
          if (-1 < (int)(uVar4 | uVar3)) {
            std::__cxx11::string::substr((ulong)&local_878,(ulong)&local_8c8);
            this_01 = (string *)&pEVar8->m_string;
LAB_00110710:
            std::__cxx11::string::operator=(this_01,(string *)&local_878);
            std::__cxx11::string::~string((string *)&local_878);
          }
        }
        else {
          bVar1 = std::operator==(&local_8a8,"Corner");
          if (bVar1) {
            string_token_iterator::find_next(&local_858);
            string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
            std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
            std::__cxx11::string::~string((string *)&local_878);
            iVar2 = atoi(local_8a8._M_dataplus._M_p);
            string_token_iterator::find_next(&local_858);
            string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
            std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
            std::__cxx11::string::~string((string *)&local_878);
            iVar12 = atoi(local_8a8._M_dataplus._M_p);
            pVVar7 = idVertex(this,iVar2);
            this_00 = this;
            pFVar9 = idFace(this,iVar12);
            pHVar10 = corner(this_00,pVVar7,pFVar9);
            string_token_iterator::find_next(&local_858);
            string_token_iterator::operator*[abi_cxx11_(&local_878,&local_858);
            std::__cxx11::string::operator=((string *)&local_8a8,(string *)&local_878);
            std::__cxx11::string::~string((string *)&local_878);
            uVar3 = std::__cxx11::string::find((char *)&local_8c8,0x1156b0);
            uVar4 = std::__cxx11::string::find((char *)&local_8c8,0x115706);
            if (-1 < (int)(uVar4 | uVar3)) {
              std::__cxx11::string::substr((ulong)&local_878,(ulong)&local_8c8);
              this_01 = (string *)&pHVar10->m_string;
              goto LAB_00110710;
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_8c8);
    plVar13 = local_888;
  } while( true );
}

Assistant:

void Solid::read( std::istream & is ) {
	char line[MAX_LINE];
	int id;

	while( is && !is.eof() && is.getline(line, MAX_LINE) )
	{		
		if( strlen( line ) == 0 ) continue;

		std::string s(line);

		string_token_iterator iter(s, " \n"); 
		
		std::string str = *iter;

		if( str == "Vertex" ) 
		{
			
			str = *(++iter);

			id = atoi( str.c_str() );


			Point p;
			for( int i = 0 ; i < 3; i ++ )
			{
				str = *(++iter);
				p[i] = atof( str.c_str() );
			}
		
			tVertex v  = createVertex( id );
			
			v->point() = p;
			v->id()    = id;

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				v->string() = s.substr( sp+1, ep-sp-1 );
			}

			continue;

		}

		if( str == "Face" ) {
			str = *(++iter);

			id = atoi( str.c_str() );
	
			int v[3];
			for( int i = 0; i < 3; i ++ ) {
				str = *(++iter);
				v[i] = atoi( str.c_str() );
			}

			tFace f = createFace( v, id );
			

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				f->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}

		//read in edge attributes
		if( str == "Edge" )
		{
			str = *(++iter);
			int id0 = atoi( str.c_str() );

			str = *(++iter);
			int id1 = atoi( str.c_str() );

			tEdge edge = idEdge( id0, id1 );
			
			str = *(++iter);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				edge->string() = s.substr( sp+1, ep-sp-1 );
			}
			
			continue;

		}

		//read in edge attributes
		if( str == "Corner" ) 
		{
			str = *(++iter);
			int id0 = atoi( str.c_str() );
				
			str = *(++iter);
			int id1 = atoi( str.c_str() );


			Vertex * v = idVertex( id0 );
			Face   * f = idFace( id1 );
			tHalfEdge he = corner( v, f );

			str = *(++iter);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				he->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}


	}

	labelBoundaryEdges();

	removeDanglingVertices();

}